

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int findreplaceengine(bstring b,bstring find,bstring repl,int pos,instr_fnptr instr)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  bstring b_00;
  bstring ptVar5;
  undefined4 *puVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  undefined4 *__ptr;
  size_t __n;
  undefined4 *puVar10;
  long lVar11;
  uint uVar12;
  bool bVar13;
  byte bVar14;
  int static_d [32];
  int local_d4;
  undefined4 local_b8 [34];
  
  bVar14 = 0;
  if (b == (bstring)0x0) {
    return -1;
  }
  if (find == (bstring)0x0 || b->data == (uchar *)0x0) {
    return -1;
  }
  if (repl == (bstring)0x0 || find->data == (uchar *)0x0) {
    return -1;
  }
  if (pos < 0) {
    return -1;
  }
  if (repl->data == (uchar *)0x0) {
    return -1;
  }
  iVar4 = find->slen;
  if (iVar4 < 1) {
    return -1;
  }
  uVar12 = b->mlen;
  if ((int)uVar12 < 0) {
    return -1;
  }
  uVar2 = b->slen;
  if (uVar12 < uVar2 || uVar12 == 0) {
    return -1;
  }
  if (repl->slen < 0) {
    return -1;
  }
  if ((int)(uVar2 - iVar4) < pos) {
    return 0;
  }
  lVar7 = (long)find->data - (long)b->data;
  b_00 = find;
  if ((lVar7 < (long)(ulong)uVar2 && pos - iVar4 < lVar7) &&
     (b_00 = bstrcpy(find), b_00 == (bstring)0x0)) {
    return -1;
  }
  lVar7 = (long)repl->data - (long)b->data;
  ptVar5 = repl;
  if ((((long)pos - (long)repl->slen < lVar7) && (lVar7 < b->slen)) &&
     (ptVar5 = bstrcpy(repl), ptVar5 == (bstring)0x0)) {
    iVar3 = -1;
    if (b_00 == find) {
      return -1;
    }
    goto LAB_0011305b;
  }
  uVar12 = b_00->slen - ptVar5->slen;
  if (uVar12 == 0) {
    for (uVar12 = (*instr)(b,pos,b_00); -1 < (int)uVar12;
        uVar12 = (*instr)(b,uVar12 + b_00->slen,b_00)) {
      memcpy(b->data + uVar12,ptVar5->data,(long)ptVar5->slen);
    }
joined_r0x00113043:
    if (b_00 != find) {
      bdestroy(b_00);
    }
    iVar3 = 0;
  }
  else {
    if (0 < (int)uVar12) {
      uVar2 = (*instr)(b,pos,b_00);
      if ((int)uVar2 < 0) {
        uVar8 = 0;
      }
      else {
        uVar8 = 0;
        lVar7 = 0;
        do {
          if ((lVar7 != 0) && (uVar2 - pos != 0 && pos <= (int)uVar2)) {
            memmove(b->data + pos + lVar7,b->data + pos,(long)(int)(uVar2 - pos));
          }
          if ((long)ptVar5->slen != 0) {
            memcpy(b->data + lVar7 + (ulong)uVar2,ptVar5->data,(long)ptVar5->slen);
          }
          pos = uVar2 + b_00->slen;
          uVar2 = (*instr)(b,pos,b_00);
          lVar7 = lVar7 - (ulong)uVar12;
          uVar8 = (ulong)((int)uVar8 + uVar12);
        } while (-1 < (int)uVar2);
      }
      if ((int)uVar8 != 0) {
        iVar4 = b->slen - pos;
        if (iVar4 != 0 && pos <= b->slen) {
          memmove(b->data + pos + -uVar8,b->data + pos,(long)iVar4);
        }
        lVar7 = (long)b->slen - (long)(int)uVar8;
        b->slen = (int)lVar7;
        b->data[lVar7] = '\0';
      }
      goto joined_r0x00113043;
    }
    __ptr = local_b8;
    iVar4 = 0x20;
    lVar7 = 1;
    local_d4 = 0;
    do {
      iVar3 = (*instr)(b,pos,b_00);
      if (iVar3 < 0) {
        __ptr[(int)lVar7 - 1] = b->slen;
        iVar4 = balloc(b,(b->slen - local_d4) + 1);
        iVar3 = -1;
        if (iVar4 == 0) {
          b->slen = b->slen - local_d4;
          if (lVar7 != 1) {
            lVar9 = (long)-local_d4;
            do {
              lVar11 = (long)b_00->slen + (long)(int)__ptr[(int)lVar7 - 2];
              iVar4 = __ptr[lVar7 + -1] - (int)lVar11;
              if (iVar4 != 0) {
                memmove(b->data + lVar11 + lVar9,b->data + lVar11,(long)iVar4);
              }
              __n = (size_t)ptVar5->slen;
              if (__n != 0) {
                memmove(b->data + lVar9 + (lVar11 - __n),ptVar5->data,__n);
              }
              lVar9 = lVar9 + (int)uVar12;
              lVar7 = lVar7 + -1;
            } while (1 < lVar7);
          }
          b->data[b->slen] = '\0';
          iVar3 = 0;
        }
        goto LAB_00113168;
      }
      if (iVar4 <= (int)lVar7) {
        bVar1 = false;
        puVar6 = (undefined4 *)0x0;
        if (local_b8 != __ptr) {
          puVar6 = __ptr;
        }
        __ptr = puVar6;
        if (SBORROW4(iVar4 * 0x10,iVar4 * 2) == iVar4 * 0xe < 0) {
          puVar6 = (undefined4 *)realloc(__ptr,(long)(iVar4 * 0x10));
          if (puVar6 == (undefined4 *)0x0) {
            bVar1 = false;
          }
          else {
            bVar1 = true;
            bVar13 = __ptr == (undefined4 *)0x0;
            __ptr = puVar6;
            if (bVar13) {
              puVar10 = local_b8;
              for (lVar9 = 0x20; lVar9 != 0; lVar9 = lVar9 + -1) {
                *puVar6 = *puVar10;
                puVar10 = puVar10 + (ulong)bVar14 * -2 + 1;
                puVar6 = puVar6 + (ulong)bVar14 * -2 + 1;
              }
            }
          }
        }
        iVar4 = iVar4 * 2;
        if (!bVar1) {
          iVar3 = -1;
          goto LAB_00113168;
        }
      }
      __ptr[lVar7 + -1] = iVar3;
      lVar7 = lVar7 + 1;
      local_d4 = local_d4 + uVar12;
      pos = iVar3 + b_00->slen;
    } while (-1 < pos);
    iVar3 = -1;
LAB_00113168:
    puVar6 = (undefined4 *)0x0;
    if (local_b8 != __ptr) {
      puVar6 = __ptr;
    }
    free(puVar6);
    if (b_00 != find) {
      bdestroy(b_00);
    }
  }
  b_00 = ptVar5;
  if (ptVar5 == repl) {
    return iVar3;
  }
LAB_0011305b:
  bdestroy(b_00);
  return iVar3;
}

Assistant:

static int findreplaceengine (bstring b, const bstring find, const bstring repl, int pos, instr_fnptr instr) {
int i, ret, slen, mlen, delta, acc;
int * d;
int static_d[32];
ptrdiff_t pd;
bstring auxf = find;
bstring auxr = repl;

	if (b == NULL || b->data == NULL || find == NULL ||
	    find->data == NULL || repl == NULL || repl->data == NULL || 
	    pos < 0 || find->slen <= 0 || b->mlen < 0 || b->slen > b->mlen || 
	    b->mlen <= 0 || b->slen < 0 || repl->slen < 0) return BSTR_ERR;
	if (pos > b->slen - find->slen) return 0;

	/* Alias with find string */
	pd = (ptrdiff_t) (find->data - b->data);
	if ((ptrdiff_t) (pos - find->slen) < pd && pd < (ptrdiff_t) b->slen) {
		if (NULL == (auxf = bstrcpy (find))) return BSTR_ERR;
	}

	/* Alias with repl string */
	pd = (ptrdiff_t) (repl->data - b->data);
	if ((ptrdiff_t) (pos - repl->slen) < pd && pd < (ptrdiff_t) b->slen) {
		if (NULL == (auxr = bstrcpy (repl))) {
			if (auxf != find) bdestroy (auxf);
			return BSTR_ERR;
		}
	}

	delta = auxf->slen - auxr->slen;

	/* in-place replacement since find and replace strings are of equal 
	   length */
	if (delta == 0) {
		while ((pos = instr (b, pos, auxf)) >= 0) {
			bstr__memcpy (b->data + pos, auxr->data, auxr->slen);
			pos += auxf->slen;
		}
		if (auxf != find) bdestroy (auxf);
		if (auxr != repl) bdestroy (auxr);
		return 0;
	}

	/* shrinking replacement since auxf->slen > auxr->slen */
	if (delta > 0) {
		acc = 0;

		while ((i = instr (b, pos, auxf)) >= 0) {
			if (acc && i > pos)
				bstr__memmove (b->data + pos - acc, b->data + pos, i - pos);
			if (auxr->slen)
				bstr__memcpy (b->data + i - acc, auxr->data, auxr->slen);
			acc += delta;
			pos = i + auxf->slen;
		}

		if (acc) {
			i = b->slen;
			if (i > pos)
				bstr__memmove (b->data + pos - acc, b->data + pos, i - pos);
			b->slen -= acc;
			b->data[b->slen] = (unsigned char) '\0';
		}

		if (auxf != find) bdestroy (auxf);
		if (auxr != repl) bdestroy (auxr);
		return 0;
	}

	/* expanding replacement since find->slen < repl->slen.  Its a lot 
	   more complicated. */

	mlen = 32;
	d = (int *) static_d; /* Avoid malloc for trivial cases */
	acc = slen = 0;

	while ((pos = instr (b, pos, auxf)) >= 0) {
		if (slen + 1 >= mlen) {
			int sl;
			int * t;
			mlen += mlen;
			sl = sizeof (int *) * mlen;
			if (static_d == d) d = NULL;
			if (sl < mlen || NULL == (t = (int *) bstr__realloc (d, sl))) {
				ret = BSTR_ERR;
				goto done;
			}
			if (NULL == d) bstr__memcpy (t, static_d, sizeof (static_d));
			d = t;
		}
		d[slen] = pos;
		slen++;
		acc -= delta;
		pos += auxf->slen;
		if (pos < 0 || acc < 0) {
			ret = BSTR_ERR;
			goto done;
		}
	}
	d[slen] = b->slen;

	if (BSTR_OK == (ret = balloc (b, b->slen + acc + 1))) {
		b->slen += acc;
		for (i = slen-1; i >= 0; i--) {
			int s, l;
			s = d[i] + auxf->slen;
			l = d[i+1] - s;
			if (l) {
				bstr__memmove (b->data + s + acc, b->data + s, l);
			}
			if (auxr->slen) {
				bstr__memmove (b->data + s + acc - auxr->slen, 
				         auxr->data, auxr->slen);
			}
			acc += delta;		
		}
		b->data[b->slen] = (unsigned char) '\0';
	}

	done:;
	if (static_d == d) d = NULL;
	bstr__free (d);
	if (auxf != find) bdestroy (auxf);
	if (auxr != repl) bdestroy (auxr);
	return ret;
}